

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O2

ssize_t amqp_ssl_socket_send(void *base,void *buf,size_t len,int flags)

{
  uint ret_code;
  int iVar1;
  ulong uVar2;
  amqp_ssl_socket_t *self;
  
  if (*(int *)((long)base + 0x10) != -1) {
    if (len < 0x80000000) {
      ERR_clear_error();
      *(undefined4 *)((long)base + 0x28) = 0;
      ret_code = SSL_write(*(SSL **)((long)base + 0x18),buf,(int)len);
      if ((int)ret_code < 1) {
        iVar1 = SSL_get_error(*(SSL **)((long)base + 0x18),ret_code);
        *(int *)((long)base + 0x28) = iVar1;
        uVar2 = 0xfffffffffffffe00;
        if (iVar1 - 2U < 5) {
          uVar2 = *(ulong *)(&DAT_0010ee58 + (ulong)(iVar1 - 2U) * 8);
        }
      }
      else {
        *(undefined4 *)((long)base + 0x28) = 0;
        uVar2 = (ulong)ret_code;
      }
    }
    else {
      uVar2 = 0xfffffffffffffff6;
    }
    return uVar2;
  }
  return -0x11;
}

Assistant:

static ssize_t amqp_ssl_socket_send(void *base, const void *buf, size_t len,
                                    AMQP_UNUSED int flags) {
  struct amqp_ssl_socket_t *self = (struct amqp_ssl_socket_t *)base;
  int res;
  if (-1 == self->sockfd) {
    return AMQP_STATUS_SOCKET_CLOSED;
  }

  /* SSL_write takes an int for length of buffer, protect against len being
   * larger than larger than what SSL_write can take */
  if (len > INT_MAX) {
    return AMQP_STATUS_INVALID_PARAMETER;
  }

  ERR_clear_error();
  self->internal_error = 0;

  /* This will only return on error, or once the whole buffer has been
   * written to the SSL stream. See SSL_MODE_ENABLE_PARTIAL_WRITE */
  res = SSL_write(self->ssl, buf, (int)len);
  if (0 >= res) {
    self->internal_error = SSL_get_error(self->ssl, res);
    /* TODO: Close connection if it isn't already? */
    /* TODO: Possibly be more intelligent in reporting WHAT went wrong */
    switch (self->internal_error) {
      case SSL_ERROR_WANT_READ:
        res = AMQP_PRIVATE_STATUS_SOCKET_NEEDREAD;
        break;
      case SSL_ERROR_WANT_WRITE:
        res = AMQP_PRIVATE_STATUS_SOCKET_NEEDWRITE;
        break;
      case SSL_ERROR_ZERO_RETURN:
        res = AMQP_STATUS_CONNECTION_CLOSED;
        break;
      default:
        res = AMQP_STATUS_SSL_ERROR;
        break;
    }
  } else {
    self->internal_error = 0;
  }

  return (ssize_t)res;
}